

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_maddv_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  char *pcVar1;
  int *piVar2;
  long *plVar3;
  short *psVar4;
  fpr_t *pfVar5;
  fpr_t *pfVar6;
  fpr_t *pfVar7;
  
  if (df < 4) {
    pfVar6 = (env->active_fpu).fpr + wd;
    pfVar5 = (env->active_fpu).fpr + ws;
    pfVar7 = (env->active_fpu).fpr + wt;
    switch(df) {
    case 0:
      *(char *)pfVar6 = *(char *)pfVar6 + *(char *)pfVar7 * *(char *)pfVar5;
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
      pcVar1 = (char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf);
      *pcVar1 = *pcVar1 + *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf) *
                          *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
      return;
    case 1:
      *(short *)pfVar6 = *(short *)pfVar6 + *(short *)pfVar7 * *(short *)pfVar5;
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
      psVar4 = (short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe);
      *psVar4 = *psVar4 + *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe) *
                          *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
      return;
    case 2:
      pfVar6->fs[0] = pfVar6->fs[0] + pfVar7->fs[0] * pfVar5->fs[0];
      piVar2 = (int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      *piVar2 = *piVar2 + *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) *
                          *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
      piVar2 = (int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      *piVar2 = *piVar2 + *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) *
                          *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      piVar2 = (int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      *piVar2 = *piVar2 + *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) *
                          *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
      return;
    case 3:
      pfVar6->fd = pfVar6->fd + pfVar7->fd * pfVar5->fd;
      plVar3 = (long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      *plVar3 = *plVar3 + *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) *
                          *(long *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      return;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x1395,
                "void helper_msa_maddv_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

MSA_TEROP_DF(maddv)
MSA_TEROP_DF(msubv)
MSA_TEROP_DF(dpadd_s)
MSA_TEROP_DF(dpadd_u)
MSA_TEROP_DF(dpsub_s)
MSA_TEROP_DF(dpsub_u)
MSA_TEROP_DF(binsl)
MSA_TEROP_DF(binsr)
MSA_TEROP_DF(madd_q)
MSA_TEROP_DF(msub_q)
MSA_TEROP_DF(maddr_q)
MSA_TEROP_DF(msubr_q)
#undef MSA_TEROP_DF

static inline void msa_splat_df(uint32_t df, wr_t *pwd,
                                wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = pws->b[n];
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = pws->h[n];
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = pws->w[n];
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = pws->d[n];
        }
       break;
    default:
        assert(0);
    }
}